

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128.cpp
# Opt level: O0

void __thiscall MetroHash128::Finalize(MetroHash128 *this,uint8_t *hash)

{
  uint64_t uVar1;
  ulong *ptr_00;
  ulong uVar2;
  ulong *in_RSI;
  ulong *in_RDI;
  uint8_t *end;
  uint8_t *ptr;
  ulong *local_18;
  
  if (0x1f < in_RDI[8]) {
    uVar1 = rotate_right((*in_RDI + in_RDI[3]) * 0xc83a91e1 + in_RDI[1],0x15);
    in_RDI[2] = uVar1 * 0x8648dbdb ^ in_RDI[2];
    uVar1 = rotate_right((in_RDI[1] + in_RDI[2]) * 0x8648dbdb + *in_RDI,0x15);
    in_RDI[3] = uVar1 * 0xc83a91e1 ^ in_RDI[3];
    uVar1 = rotate_right((*in_RDI + in_RDI[2]) * 0xc83a91e1 + in_RDI[3],0x15);
    *in_RDI = uVar1 * 0x8648dbdb ^ *in_RDI;
    uVar1 = rotate_right((in_RDI[1] + in_RDI[3]) * 0x8648dbdb + in_RDI[2],0x15);
    in_RDI[1] = uVar1 * 0xc83a91e1 ^ in_RDI[1];
  }
  ptr_00 = in_RDI + 4;
  uVar2 = in_RDI[8] & 0x1f;
  local_18 = ptr_00;
  if (0xf < uVar2) {
    uVar1 = read_u64(ptr_00);
    *in_RDI = uVar1 * 0x7bdec03b + *in_RDI;
    uVar1 = rotate_right(*in_RDI,0x21);
    *in_RDI = uVar1 * 0x2f5870a5;
    uVar1 = read_u64(in_RDI + 5);
    in_RDI[1] = uVar1 * 0x7bdec03b + in_RDI[1];
    local_18 = in_RDI + 6;
    uVar1 = rotate_right(in_RDI[1],0x21);
    in_RDI[1] = uVar1 * 0x2f5870a5;
    uVar1 = rotate_right(*in_RDI * 0x7bdec03b + in_RDI[1],0x2d);
    *in_RDI = uVar1 * 0x8648dbdb ^ *in_RDI;
    uVar1 = rotate_right(in_RDI[1] * 0x2f5870a5 + *in_RDI,0x2d);
    in_RDI[1] = uVar1 * 0xc83a91e1 ^ in_RDI[1];
  }
  if (7 < (long)((long)ptr_00 + (uVar2 - (long)local_18))) {
    uVar1 = read_u64(local_18);
    *in_RDI = uVar1 * 0x7bdec03b + *in_RDI;
    local_18 = local_18 + 1;
    uVar1 = rotate_right(*in_RDI,0x21);
    *in_RDI = uVar1 * 0x2f5870a5;
    uVar1 = rotate_right(*in_RDI * 0x7bdec03b + in_RDI[1],0x1b);
    *in_RDI = uVar1 * 0x8648dbdb ^ *in_RDI;
  }
  if (3 < (long)((long)ptr_00 + (uVar2 - (long)local_18))) {
    uVar1 = read_u32(local_18);
    in_RDI[1] = uVar1 * 0x7bdec03b + in_RDI[1];
    local_18 = (ulong *)((long)local_18 + 4);
    uVar1 = rotate_right(in_RDI[1],0x21);
    in_RDI[1] = uVar1 * 0x2f5870a5;
    uVar1 = rotate_right(in_RDI[1] * 0x2f5870a5 + *in_RDI,0x2e);
    in_RDI[1] = uVar1 * 0xc83a91e1 ^ in_RDI[1];
  }
  if (1 < (long)((long)ptr_00 + (uVar2 - (long)local_18))) {
    uVar1 = read_u16(local_18);
    *in_RDI = uVar1 * 0x7bdec03b + *in_RDI;
    local_18 = (ulong *)((long)local_18 + 2);
    uVar1 = rotate_right(*in_RDI,0x21);
    *in_RDI = uVar1 * 0x2f5870a5;
    uVar1 = rotate_right(*in_RDI * 0x7bdec03b + in_RDI[1],0x16);
    *in_RDI = uVar1 * 0x8648dbdb ^ *in_RDI;
  }
  if (0 < (long)((long)ptr_00 + (uVar2 - (long)local_18))) {
    uVar1 = read_u8(local_18);
    in_RDI[1] = uVar1 * 0x7bdec03b + in_RDI[1];
    uVar1 = rotate_right(in_RDI[1],0x21);
    in_RDI[1] = uVar1 * 0x2f5870a5;
    uVar1 = rotate_right(in_RDI[1] * 0x2f5870a5 + *in_RDI,0x3a);
    in_RDI[1] = uVar1 * 0xc83a91e1 ^ in_RDI[1];
  }
  uVar1 = rotate_right(*in_RDI * 0xc83a91e1 + in_RDI[1],0xd);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = rotate_right(in_RDI[1] * 0x8648dbdb + *in_RDI,0x25);
  in_RDI[1] = uVar1 + in_RDI[1];
  uVar1 = rotate_right(*in_RDI * 0x7bdec03b + in_RDI[1],0xd);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = rotate_right(in_RDI[1] * 0x2f5870a5 + *in_RDI,0x25);
  in_RDI[1] = uVar1 + in_RDI[1];
  in_RDI[8] = 0;
  *in_RSI = *in_RDI;
  in_RSI[1] = in_RDI[1];
  return;
}

Assistant:

void MetroHash128::Finalize(uint8_t * const hash)
{
    // finalize bulk loop, if used
    if (bytes >= 32)
    {
        state.v[2] ^= rotate_right(((state.v[0] + state.v[3]) * k0) + state.v[1], 21) * k1;
        state.v[3] ^= rotate_right(((state.v[1] + state.v[2]) * k1) + state.v[0], 21) * k0;
        state.v[0] ^= rotate_right(((state.v[0] + state.v[2]) * k0) + state.v[3], 21) * k1;
        state.v[1] ^= rotate_right(((state.v[1] + state.v[3]) * k1) + state.v[2], 21) * k0;
    }
    
    // process any bytes remaining in the input buffer
    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(input.b);
    const uint8_t * const end = ptr + (bytes % 32);
    
    if ((end - ptr) >= 16)
    {
        state.v[0] += read_u64(ptr) * k2; ptr += 8; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[1] += read_u64(ptr) * k2; ptr += 8; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 45) * k1;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 45) * k0;
    }

    if ((end - ptr) >= 8)
    {
        state.v[0] += read_u64(ptr) * k2; ptr += 8; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 27) * k1;
    }

    if ((end - ptr) >= 4)
    {
        state.v[1] += read_u32(ptr) * k2; ptr += 4; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 46) * k0;
    }

    if ((end - ptr) >= 2)
    {
        state.v[0] += read_u16(ptr) * k2; ptr += 2; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 22) * k1;
    }

    if ((end - ptr) >= 1)
    {
        state.v[1] += read_u8 (ptr) * k2; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 58) * k0;
    }
    
    state.v[0] += rotate_right((state.v[0] * k0) + state.v[1], 13);
    state.v[1] += rotate_right((state.v[1] * k1) + state.v[0], 37);
    state.v[0] += rotate_right((state.v[0] * k2) + state.v[1], 13);
    state.v[1] += rotate_right((state.v[1] * k3) + state.v[0], 37);

    bytes = 0;

    // do any endian conversion here

    memcpy(hash, state.v, 16);
}